

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_suffix(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos74;
  int yypos74;
  int yythunkpos72;
  int yypos72;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = yy_primary(G);
  if (iVar4 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    iVar1 = G->pos;
    iVar2 = G->thunkpos;
    iVar4 = G->pos;
    iVar3 = G->thunkpos;
    iVar5 = yy_QUESTION(G);
    if (iVar5 == 0) {
      G->pos = iVar4;
      G->thunkpos = iVar3;
      iVar5 = yy_STAR(G);
      if (iVar5 == 0) {
        G->pos = iVar4;
        G->thunkpos = iVar3;
        iVar4 = yy_PLUS(G);
        if (iVar4 == 0) {
          G->pos = iVar1;
          G->thunkpos = iVar2;
        }
        else {
          yyDo(G,yy_3_suffix,G->begin,G->end,"yy_3_suffix");
        }
      }
      else {
        yyDo(G,yy_2_suffix,G->begin,G->end,"yy_2_suffix");
      }
    }
    else {
      yyDo(G,yy_1_suffix,G->begin,G->end,"yy_1_suffix");
    }
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_suffix(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "suffix"));
  if (!yy_primary(G))  goto l71;

  {  int yypos72= G->pos, yythunkpos72= G->thunkpos;
  {  int yypos74= G->pos, yythunkpos74= G->thunkpos;  if (!yy_QUESTION(G))  goto l75;
  yyDo(G, yy_1_suffix, G->begin, G->end, "yy_1_suffix");
  goto l74;
  l75:;	  G->pos= yypos74; G->thunkpos= yythunkpos74;  if (!yy_STAR(G))  goto l76;
  yyDo(G, yy_2_suffix, G->begin, G->end, "yy_2_suffix");
  goto l74;
  l76:;	  G->pos= yypos74; G->thunkpos= yythunkpos74;  if (!yy_PLUS(G))  goto l72;
  yyDo(G, yy_3_suffix, G->begin, G->end, "yy_3_suffix");

  }
  l74:;	  goto l73;
  l72:;	  G->pos= yypos72; G->thunkpos= yythunkpos72;
  }
  l73:;	  yyprintf((stderr, "  ok   suffix"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l71:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "suffix"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}